

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_expression(Parser *this)

{
  string *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Tokenizer *pTVar2;
  pointer pcVar3;
  const_iterator cVar4;
  ostream *poVar5;
  string symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar5 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\t\t\t<expression>",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pTVar2 = this->tokenizer;
  __k = &this->cur_token;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(pTVar2->op_map)._M_t,__k);
  if ((_Rb_tree_header *)cVar4._M_node == &(pTVar2->op_map)._M_t._M_impl.super__Rb_tree_header) {
    expression_writer(this,__k);
  }
  parse_term(this);
  pTVar2 = this->tokenizer;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(pTVar2->op_map)._M_t,__k);
  if ((_Rb_tree_header *)cVar4._M_node != &(pTVar2->op_map)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_50.field_2;
    do {
      poVar5 = (ostream *)this->out_file;
      std::operator+(&local_50,"\t\t\t\t\t<symbol>",__k);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</symbol>",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (this->cur_token)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + (this->cur_token)._M_string_length);
      query_tokenizer(this);
      expression_writer(this,__k);
      parse_term(this);
      expression_writer(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = this->tokenizer;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(pTVar2->op_map)._M_t,__k);
    } while ((_Rb_tree_header *)cVar4._M_node !=
             &(pTVar2->op_map)._M_t._M_impl.super__Rb_tree_header);
  }
  poVar5 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\t\t\t</expression>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::parse_expression() {
    out_file << "\t\t\t\t<expression>" << std::endl;
    if (!tokenizer.op_exists(cur_token)) {
        expression_writer(cur_token);
    }
    parse_term();

    while (tokenizer.op_exists(cur_token)) {
        out_file << "\t\t\t\t\t<symbol>" + cur_token << "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        expression_writer(cur_token);
        parse_term();
        expression_writer(symbol);
    }

    out_file << "\t\t\t\t</expression>" << std::endl;
}